

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitops.h
# Opt level: O0

void select_xor128(uint32_t *out,uint32_t *if0,uint32_t *if1,uint8_t bit)

{
  uint32_t uVar1;
  uint uVar2;
  uint32_t mask0;
  uint32_t mask1;
  uint8_t bit_local;
  uint32_t *if1_local;
  uint32_t *if0_local;
  uint32_t *out_local;
  
  uVar1 = mask_u32((uint)bit,1);
  uVar2 = uVar1 ^ 0xffffffff;
  *out = (*if0 & uVar2 | *if1 & uVar1) ^ *out;
  out[1] = (if0[1] & uVar2 | if1[1] & uVar1) ^ out[1];
  out[2] = (if0[2] & uVar2 | if1[2] & uVar1) ^ out[2];
  out[3] = (if0[3] & uVar2 | if1[3] & uVar1) ^ out[3];
  return;
}

Assistant:

static inline void select_xor128(uint32_t out[4],
                                 const uint32_t if0[4],
                                 const uint32_t if1[4],
                                 uint8_t bit)
{
  uint32_t mask1 = mask_u32(bit, 1);
  uint32_t mask0 = ~mask1;

  out[0] ^= (if0[0] & mask0) | (if1[0] & mask1);
  out[1] ^= (if0[1] & mask0) | (if1[1] & mask1);
  out[2] ^= (if0[2] & mask0) | (if1[2] & mask1);
  out[3] ^= (if0[3] & mask0) | (if1[3] & mask1);
}